

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O3

void __thiscall
agge::tests::VectorRasterizerTests::BoundsAreResetOnRequest(VectorRasterizerTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FailedAssertion *pFVar3;
  int iVar4;
  int iVar5;
  vector_rasterizer vr;
  string local_110;
  string local_f0;
  LocationInfo local_d0;
  vector_rasterizer local_a8;
  
  vector_rasterizer::vector_rasterizer(&local_a8);
  vector_rasterizer::line(&local_a8,0xd00,0x1100,0xd80,0x11b3);
  vector_rasterizer::reset(&local_a8);
  iVar5 = local_a8._max_y;
  iVar4 = local_a8._min_y;
  paVar1 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_d0,&local_110,0x6d);
  if ((iVar4 <= iVar5) && (local_a8._max_x + 1 != local_a8._min_x)) {
    pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar3,&local_f0,&local_d0);
    __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  paVar2 = &local_d0.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_d0,&local_110,0x6e);
  if (local_a8._max_y - local_a8._min_y == -1 || local_a8._max_y < local_a8._min_y) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_a8._x_sorted_cells._begin != (cell *)0x0) {
      operator_delete__(local_a8._x_sorted_cells._begin);
    }
    if (local_a8._histogram_x._begin != (uint *)0x0) {
      operator_delete__(local_a8._histogram_x._begin);
    }
    if (local_a8._histogram_y._begin != (uint *)0x0) {
      operator_delete__(local_a8._histogram_y._begin);
    }
    if (local_a8._cells._begin != (cell *)0x0) {
      operator_delete__(local_a8._cells._begin);
    }
    return;
  }
  pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Values are not equal!","");
  ut::FailedAssertion::FailedAssertion(pFVar3,&local_f0,&local_d0);
  __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( BoundsAreResetOnRequest )
			{
				// INIT
				vector_rasterizer vr;

				vr.line(fp(13.0), fp(17.0), fp(13.5), fp(17.7));

				// ACT
				vr.reset();

				// ACT / ASSERT
				assert_equal(0, vr.width());
				assert_equal(0, vr.height());
			}